

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChebTools.cpp
# Opt level: O1

VectorXd __thiscall ChebTools::ChebyshevExpansion::get_nodes_realworld(ChebyshevExpansion *this)

{
  double *pdVar1;
  double *pdVar2;
  ulong uVar3;
  double *pdVar4;
  double dVar5;
  double *pdVar6;
  Index size;
  DenseStorage<double,__1,__1,_1,_0> *other;
  Index index;
  ulong uVar7;
  Index extraout_RDX;
  long in_RSI;
  long lVar8;
  Index othersize;
  VectorXd VVar9;
  DenseStorage<double,__1,__1,_1,_0> local_48;
  double local_38;
  undefined8 uStack_30;
  double local_28;
  undefined8 uStack_20;
  
  local_38 = *(double *)(in_RSI + 0x18) - *(double *)(in_RSI + 0x10);
  uStack_30 = 0;
  other = (DenseStorage<double,__1,__1,_1,_0> *)
          ChebyshevLobattoNodesLibrary::get
                    ((ChebyshevLobattoNodesLibrary *)CLnodes_library,*(long *)(in_RSI + 8) - 1);
  Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage(&local_48,other);
  if (local_48.m_rows < 0) {
    __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/usnistgov[P]ChebTools/externals/Eigen/Eigen/src/Core/CwiseNullaryOp.h"
                  ,0x4a,
                  "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Array<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = const Eigen::Array<double, -1, 1>]"
                 );
  }
  local_28 = *(double *)(in_RSI + 0x18) + *(double *)(in_RSI + 0x10);
  uStack_20 = 0;
  (this->m_c).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x0;
  (this->m_c).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
  Eigen::DenseStorage<double,_-1,_-1,_1,_0>::resize
            ((DenseStorage<double,__1,__1,_1,_0> *)this,local_48.m_rows,local_48.m_rows,1);
  pdVar6 = local_48.m_data;
  if ((this->m_c).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows !=
      local_48.m_rows) {
    Eigen::DenseStorage<double,_-1,_-1,_1,_0>::resize
              ((DenseStorage<double,__1,__1,_1,_0> *)this,local_48.m_rows,local_48.m_rows,1);
  }
  uVar3 = (this->m_c).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
          m_rows;
  if (uVar3 != local_48.m_rows) {
    __assert_fail("dst.rows() == dstRows && dst.cols() == dstCols",
                  "/workspace/llm4binary/github/license_c_cmakelists/usnistgov[P]ChebTools/externals/Eigen/Eigen/src/Core/AssignEvaluator.h"
                  ,0x2fd,
                  "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, 1>, SrcXprType = Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Array<double, -1, 1>>, const Eigen::ArrayWrapper<Eigen::Matrix<double, -1, 1>>>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Array<double, -1, 1>>>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Array<double, -1, 1>>>, T1 = double, T2 = double]"
                 );
  }
  pdVar4 = (this->m_c).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
           m_data;
  uVar7 = uVar3 - ((long)uVar3 >> 0x3f) & 0xfffffffffffffffe;
  if (1 < (long)uVar3) {
    lVar8 = 0;
    do {
      pdVar1 = pdVar6 + lVar8;
      dVar5 = pdVar1[1];
      pdVar2 = pdVar4 + lVar8;
      *pdVar2 = (*pdVar1 * local_38 + local_28) * 0.5;
      pdVar2[1] = (dVar5 * local_38 + local_28) * 0.5;
      lVar8 = lVar8 + 2;
    } while (lVar8 < (long)uVar7);
  }
  if ((long)uVar7 < (long)uVar3) {
    do {
      pdVar4[uVar7] = (pdVar6[uVar7] * local_38 + local_28) * 0.5;
      uVar7 = uVar7 + 1;
    } while (uVar3 != uVar7);
  }
  free(local_48.m_data);
  VVar9.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
       extraout_RDX;
  VVar9.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)this;
  return (VectorXd)VVar9.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage;
}

Assistant:

Eigen::VectorXd ChebyshevExpansion::get_nodes_realworld() {
        return ((m_xmax - m_xmin)*get_nodes_n11().array() + (m_xmax + m_xmin))*0.5;
    }